

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_parser.tab.cc
# Opt level: O3

string * __thiscall
MC::MC_Parser::yysyntax_error__abi_cxx11_
          (string *__return_storage_ptr__,MC_Parser *this,context *yyctx)

{
  symbol_kind_type sVar1;
  uint uVar2;
  int iVar3;
  context *extraout_RDX;
  context *extraout_RDX_00;
  context *extraout_RDX_01;
  context *extraout_RDX_02;
  char *pcVar4;
  long lVar5;
  symbol_kind_type yyarg [5];
  string local_68;
  symbol_kind_type local_48 [6];
  
  sVar1 = (yyctx->yyla_->super_basic_symbol<MC::MC_Parser::by_kind>).super_by_kind.kind_;
  pcVar4 = "syntax error";
  iVar3 = 0;
  if (sVar1 != S_YYEMPTY) {
    local_48[0] = sVar1;
    uVar2 = context::expected_tokens(yyctx,local_48 + 1,4);
    iVar3 = uVar2 + 1;
    yyctx = extraout_RDX;
    if (uVar2 < 5) {
      yyctx = (context *)&DAT_0014f270;
      pcVar4 = &DAT_0014f270 + *(int *)(&DAT_0014f270 + (ulong)uVar2 * 4);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar5 = 0;
  do {
    if (*pcVar4 == '%') {
      if ((pcVar4[1] != 's') || (iVar3 <= lVar5)) goto LAB_00147b3e;
      yytnamerr__abi_cxx11_
                (&local_68,*(MC_Parser **)(yytname_ + (long)local_48[lVar5] * 8),(char *)yyctx);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
      yyctx = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        yyctx = extraout_RDX_02;
      }
      pcVar4 = pcVar4 + 1;
      lVar5 = lVar5 + 1;
    }
    else {
      if (*pcVar4 == '\0') {
        return __return_storage_ptr__;
      }
LAB_00147b3e:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      yyctx = extraout_RDX_00;
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

std::string
  MC_Parser::yysyntax_error_ (const context& yyctx) const
  {
    // Its maximum.
    enum { YYARGS_MAX = 5 };
    // Arguments of yyformat.
    symbol_kind_type yyarg[YYARGS_MAX];
    int yycount = yy_syntax_error_arguments_ (yyctx, yyarg, YYARGS_MAX);

    char const* yyformat = YY_NULLPTR;
    switch (yycount)
      {
#define YYCASE_(N, S)                         \
        case N:                               \
          yyformat = S;                       \
        break
      default: // Avoid compiler warnings.
        YYCASE_ (0, YY_("syntax error"));
        YYCASE_ (1, YY_("syntax error, unexpected %s"));
        YYCASE_ (2, YY_("syntax error, unexpected %s, expecting %s"));
        YYCASE_ (3, YY_("syntax error, unexpected %s, expecting %s or %s"));
        YYCASE_ (4, YY_("syntax error, unexpected %s, expecting %s or %s or %s"));
        YYCASE_ (5, YY_("syntax error, unexpected %s, expecting %s or %s or %s or %s"));
#undef YYCASE_
      }

    std::string yyres;
    // Argument number.
    std::ptrdiff_t yyi = 0;
    for (char const* yyp = yyformat; *yyp; ++yyp)
      if (yyp[0] == '%' && yyp[1] == 's' && yyi < yycount)
        {
          yyres += symbol_name (yyarg[yyi++]);
          ++yyp;
        }
      else
        yyres += *yyp;
    return yyres;
  }